

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<_db0c8446_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,slang::ast::PackageSymbol_const*,slang::Hasher<slang::ast::PackageSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::PackageSymbol_const*,std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,slang::Hasher<slang::ast::PackageSymbol_const*>>,std::equal_to<slang::ast:...cator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>>>
::
emplace<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>
          (sherwood_v3_table<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,slang::ast::PackageSymbol_const*,slang::Hasher<slang::ast::PackageSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::PackageSymbol_const*,std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>,slang::Hasher<slang::ast::PackageSymbol_const*>>,std::equal_to<slang::ast:___cator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>>>
           *this,pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                 *key)

{
  EntryPointer psVar1;
  long lVar2;
  EntryPointer psVar3;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<_db0c8446_> pVar4;
  
  lVar2 = ((ulong)((long)key->first * -0x61c8864680b583eb) >> ((byte)this[0x10] & 0x3f)) * 0x30;
  current_entry = (EntryPointer)(*(long *)this + lVar2);
  if (*(char *)(*(long *)this + lVar2) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar3 = current_entry;
    do {
      if (key->first == (psVar3->field_1).value.first) {
        pVar4._8_8_ = 0;
        pVar4.first.current = psVar3;
        return pVar4;
      }
      current_entry = psVar3 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar3 + 1;
      psVar3 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar4 = emplace_new_key<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>
                    (this,distance_from_desired,current_entry,key);
  return pVar4;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }